

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<double_const&>::operator<=
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,approx *rhs)

{
  double dVar1;
  double dVar2;
  lest *this_00;
  bool bVar3;
  approx *in_R8;
  double dVar4;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = *(lest **)this;
  dVar1 = *(double *)this_00;
  dVar2 = rhs->magnitude_;
  bVar3 = true;
  if (dVar2 <= dVar1) {
    dVar4 = ABS(dVar2);
    if (ABS(dVar1) <= ABS(dVar2)) {
      dVar4 = ABS(dVar1);
    }
    bVar3 = ABS(dVar1 - dVar2) < (dVar4 + rhs->scale_) * rhs->epsilon_;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<=","");
  to_string<double,lest::approx>(&local_70,this_00,(double *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar3;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }